

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFAcroFormDocumentHelper.cc
# Opt level: O0

void __thiscall
QPDFAcroFormDocumentHelper::fixCopiedAnnotations
          (QPDFAcroFormDocumentHelper *this,QPDFObjectHandle *to_page,QPDFObjectHandle *from_page,
          QPDFAcroFormDocumentHelper *from_afdh,
          set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_> *added_fields)

{
  size_t *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_01;
  bool bVar1;
  int iVar2;
  QPDF *from_qpdf;
  QPDFObjGen local_190;
  reference local_188;
  QPDFObjectHandle *f;
  iterator __end2;
  iterator __begin2;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *__range2;
  QPDFObjectHandle local_150;
  allocator<char> local_139;
  string local_138;
  QPDFMatrix local_118;
  QPDFObjectHandle local_e8;
  undefined1 local_d8 [8];
  set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_> old_fields;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> new_fields;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> new_annots;
  allocator<char> local_61;
  string local_60 [32];
  undefined1 local_40 [8];
  QPDFObjectHandle old_annots;
  set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_> *added_fields_local;
  QPDFAcroFormDocumentHelper *from_afdh_local;
  QPDFObjectHandle *from_page_local;
  QPDFObjectHandle *to_page_local;
  QPDFAcroFormDocumentHelper *this_local;
  
  old_annots.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)added_fields;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_60,"/Annots",&local_61);
  QPDFObjectHandle::getKey((QPDFObjectHandle *)local_40,(string *)from_page);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator(&local_61);
  bVar1 = QPDFObjectHandle::isArray((QPDFObjectHandle *)local_40);
  if ((bVar1) &&
     (iVar2 = QPDFObjectHandle::getArrayNItems((QPDFObjectHandle *)local_40), iVar2 != 0)) {
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::vector
              ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
               &new_fields.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::vector
              ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
               &old_fields._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>::set
              ((set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_> *)local_d8);
    QPDFObjectHandle::QPDFObjectHandle(&local_e8,(QPDFObjectHandle *)local_40);
    QPDFMatrix::QPDFMatrix(&local_118);
    from_qpdf = QPDFDocumentHelper::getQPDF(&from_afdh->super_QPDFDocumentHelper);
    transformAnnotations
              (this,&local_e8,
               (vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
               &new_fields.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,
               (vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
               &old_fields._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_> *)local_d8,
               &local_118,from_qpdf,from_afdh);
    QPDFObjectHandle::~QPDFObjectHandle(&local_e8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"/Annots",&local_139);
    QPDFObjectHandle::newArray
              (&local_150,
               (vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
               &new_fields.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    QPDFObjectHandle::replaceKey(to_page,&local_138,&local_150);
    QPDFObjectHandle::~QPDFObjectHandle(&local_150);
    std::__cxx11::string::~string((string *)&local_138);
    std::allocator<char>::~allocator(&local_139);
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::vector
              ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&__range2,
               (vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
               &old_fields._M_t._M_impl.super__Rb_tree_header._M_node_count);
    addAndRenameFormFields
              (this,(vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&__range2);
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
              ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&__range2);
    if (old_annots.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      this_00 = &old_fields._M_t._M_impl.super__Rb_tree_header._M_node_count;
      __end2 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::begin
                         ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)this_00);
      f = (QPDFObjectHandle *)
          std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::end
                    ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)this_00);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
                                         *)&f), bVar1) {
        local_188 = __gnu_cxx::
                    __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
                    ::operator*(&__end2);
        this_01 = old_annots.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        local_190 = QPDFObjectHandle::getObjGen(local_188);
        std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>::insert
                  ((set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_> *)
                   this_01._M_pi,&local_190);
        __gnu_cxx::
        __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
        ::operator++(&__end2);
      }
    }
    std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>::~set
              ((set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_> *)local_d8);
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
              ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
               &old_fields._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
              ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
               &new_fields.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_40);
  return;
}

Assistant:

void
QPDFAcroFormDocumentHelper::fixCopiedAnnotations(
    QPDFObjectHandle to_page,
    QPDFObjectHandle from_page,
    QPDFAcroFormDocumentHelper& from_afdh,
    std::set<QPDFObjGen>* added_fields)
{
    auto old_annots = from_page.getKey("/Annots");
    if ((!old_annots.isArray()) || (old_annots.getArrayNItems() == 0)) {
        return;
    }

    std::vector<QPDFObjectHandle> new_annots;
    std::vector<QPDFObjectHandle> new_fields;
    std::set<QPDFObjGen> old_fields;
    transformAnnotations(
        old_annots,
        new_annots,
        new_fields,
        old_fields,
        QPDFMatrix(),
        &(from_afdh.getQPDF()),
        &from_afdh);

    to_page.replaceKey("/Annots", QPDFObjectHandle::newArray(new_annots));
    addAndRenameFormFields(new_fields);
    if (added_fields) {
        for (auto const& f: new_fields) {
            added_fields->insert(f.getObjGen());
        }
    }
}